

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloopback.c
# Opt level: O0

char * TypeName(ALCenum type)

{
  ALCenum type_local;
  char *local_8;
  
  switch(type) {
  case 0x1400:
    local_8 = "S8";
    break;
  case 0x1401:
    local_8 = "U8";
    break;
  case 0x1402:
    local_8 = "S16";
    break;
  case 0x1403:
    local_8 = "U16";
    break;
  case 0x1404:
    local_8 = "S32";
    break;
  case 0x1405:
    local_8 = "U32";
    break;
  case 0x1406:
    local_8 = "Float32";
    break;
  default:
    local_8 = "Unknown Type";
  }
  return local_8;
}

Assistant:

static const char *TypeName(ALCenum type)
{
    switch(type)
    {
    case ALC_BYTE_SOFT: return "S8";
    case ALC_UNSIGNED_BYTE_SOFT: return "U8";
    case ALC_SHORT_SOFT: return "S16";
    case ALC_UNSIGNED_SHORT_SOFT: return "U16";
    case ALC_INT_SOFT: return "S32";
    case ALC_UNSIGNED_INT_SOFT: return "U32";
    case ALC_FLOAT_SOFT: return "Float32";
    }
    return "Unknown Type";
}